

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O3

void start_pass(j_decompress_ptr cinfo)

{
  double dVar1;
  int iVar2;
  J_DCT_METHOD JVar3;
  jpeg_inverse_dct *pjVar4;
  JQUANT_TBL *pJVar5;
  void *pvVar6;
  jpeg_error_mgr *pjVar7;
  int iVar8;
  int iVar9;
  inverse_DCT_method_ptr p_Var10;
  code *pcVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  double *pdVar16;
  long lVar17;
  jpeg_component_info *pjVar18;
  
  if (0 < cinfo->num_components) {
    pjVar18 = cinfo->comp_info;
    pjVar4 = cinfo->idct;
    lVar17 = 0;
    iVar9 = 0;
    p_Var10 = (inverse_DCT_method_ptr)0x0;
    do {
      iVar2 = pjVar18->DCT_scaled_size;
      pcVar11 = jpeg_idct_1x1;
      iVar8 = 0;
      switch(iVar2) {
      case 1:
        goto switchD_001415db_caseD_1;
      case 2:
        iVar9 = jsimd_can_idct_2x2();
        pcVar11 = jsimd_idct_2x2;
        if (iVar9 == 0) {
          pcVar11 = jpeg_idct_2x2;
        }
        goto LAB_00141661;
      case 3:
        pcVar11 = jpeg_idct_3x3;
        break;
      case 4:
        iVar9 = jsimd_can_idct_4x4();
        pcVar11 = jsimd_idct_4x4;
        if (iVar9 == 0) {
          pcVar11 = jpeg_idct_4x4;
        }
LAB_00141661:
        iVar8 = 0;
        goto switchD_001415db_caseD_1;
      case 5:
        pcVar11 = jpeg_idct_5x5;
        break;
      case 6:
        pcVar11 = jpeg_idct_6x6;
        break;
      case 7:
        pcVar11 = jpeg_idct_7x7;
        break;
      case 8:
        JVar3 = cinfo->dct_method;
        if (JVar3 == JDCT_FLOAT) {
          iVar9 = jsimd_can_idct_float();
          pcVar11 = jsimd_idct_float;
          if (iVar9 == 0) {
            pcVar11 = jpeg_idct_float;
          }
          iVar8 = 2;
        }
        else if (JVar3 == JDCT_IFAST) {
          iVar9 = jsimd_can_idct_ifast();
          pcVar11 = jsimd_idct_ifast;
          if (iVar9 == 0) {
            pcVar11 = jpeg_idct_ifast;
          }
          iVar8 = 1;
        }
        else {
          if (JVar3 == JDCT_ISLOW) {
            iVar9 = jsimd_can_idct_islow();
            pcVar11 = jsimd_idct_islow;
            if (iVar9 == 0) {
              pcVar11 = jpeg_idct_islow;
            }
            goto LAB_00141661;
          }
          pjVar7 = cinfo->err;
          pjVar7->msg_code = 0x30;
          (*pjVar7->error_exit)((j_common_ptr)cinfo);
          pcVar11 = p_Var10;
          iVar8 = iVar9;
        }
        goto switchD_001415db_caseD_1;
      case 9:
        pcVar11 = jpeg_idct_9x9;
        break;
      case 10:
        pcVar11 = jpeg_idct_10x10;
        break;
      case 0xb:
        pcVar11 = jpeg_idct_11x11;
        break;
      case 0xc:
        pcVar11 = jpeg_idct_12x12;
        break;
      case 0xd:
        pcVar11 = jpeg_idct_13x13;
        break;
      case 0xe:
        pcVar11 = jpeg_idct_14x14;
        break;
      case 0xf:
        pcVar11 = jpeg_idct_15x15;
        break;
      case 0x10:
        pcVar11 = jpeg_idct_16x16;
        break;
      default:
        pjVar7 = cinfo->err;
        pjVar7->msg_code = 7;
        (pjVar7->msg_parm).i[0] = iVar2;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        pcVar11 = p_Var10;
        iVar8 = iVar9;
        goto switchD_001415db_caseD_1;
      }
      iVar8 = 0;
switchD_001415db_caseD_1:
      iVar9 = iVar8;
      pjVar4->inverse_DCT[lVar17] = pcVar11;
      if (((pjVar18->component_needed != 0) &&
          (*(int *)((long)pjVar4[1].inverse_DCT + lVar17 * 4 + -8) != iVar9)) &&
         (pJVar5 = pjVar18->quant_table, pJVar5 != (JQUANT_TBL *)0x0)) {
        *(int *)((long)pjVar4[1].inverse_DCT + lVar17 * 4 + -8) = iVar9;
        pvVar6 = pjVar18->dct_table;
        lVar13 = 0;
        if (iVar9 == 0) {
          do {
            *(UINT16 *)((long)pvVar6 + lVar13 * 2) = pJVar5->quantval[lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0x40);
        }
        else if (iVar9 == 1) {
          do {
            *(short *)((long)pvVar6 + lVar13) =
                 (short)((int)*(short *)((long)start_pass::aanscales + lVar13) *
                         (uint)*(ushort *)((long)pJVar5->quantval + lVar13) + 0x800 >> 0xc);
            lVar13 = lVar13 + 2;
          } while (lVar13 != 0x80);
        }
        else {
          lVar14 = 0;
          do {
            lVar15 = (long)(int)lVar14;
            lVar14 = lVar15 + 8;
            dVar1 = start_pass::aanscalefactor[lVar13];
            pdVar16 = start_pass::aanscalefactor;
            lVar12 = 0;
            do {
              *(ulong *)((long)pvVar6 + lVar12 * 4 + lVar15 * 4) =
                   CONCAT44((float)((double)(*(uint *)(pJVar5->quantval + lVar15 + lVar12) >> 0x10)
                                    * dVar1 * pdVar16[1]),
                            (float)((double)(*(uint *)(pJVar5->quantval + lVar15 + lVar12) & 0xffff)
                                    * dVar1 * *pdVar16));
              lVar12 = lVar12 + 2;
              pdVar16 = pdVar16 + 2;
            } while (lVar12 != 8);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 8);
        }
      }
      lVar17 = lVar17 + 1;
      pjVar18 = pjVar18 + 1;
      p_Var10 = pcVar11;
    } while (lVar17 < cinfo->num_components);
  }
  return;
}

Assistant:

METHODDEF(void)
start_pass(j_compress_ptr cinfo, boolean gather_statistics)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  int ci, tbl;
  jpeg_component_info *compptr;

  if (gather_statistics)
    /* Make sure to avoid that in the master control logic!
     * We are fully adaptive here and need no extra
     * statistics gathering pass!
     */
    ERREXIT(cinfo, JERR_NOT_COMPILED);

  /* We assume jcmaster.c already validated the progressive scan parameters. */

  /* Select execution routines */
  if (cinfo->progressive_mode) {
    if (cinfo->Ah == 0) {
      if (cinfo->Ss == 0)
        entropy->pub.encode_mcu = encode_mcu_DC_first;
      else
        entropy->pub.encode_mcu = encode_mcu_AC_first;
    } else {
      if (cinfo->Ss == 0)
        entropy->pub.encode_mcu = encode_mcu_DC_refine;
      else
        entropy->pub.encode_mcu = encode_mcu_AC_refine;
    }
  } else
    entropy->pub.encode_mcu = encode_mcu;

  /* Allocate & initialize requested statistics areas */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    /* DC needs no table for refinement scan */
    if (cinfo->progressive_mode == 0 || (cinfo->Ss == 0 && cinfo->Ah == 0)) {
      tbl = compptr->dc_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
        ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->dc_stats[tbl] == NULL)
        entropy->dc_stats[tbl] = (unsigned char *)(*cinfo->mem->alloc_small)
          ((j_common_ptr)cinfo, JPOOL_IMAGE, DC_STAT_BINS);
      MEMZERO(entropy->dc_stats[tbl], DC_STAT_BINS);
      /* Initialize DC predictions to 0 */
      entropy->last_dc_val[ci] = 0;
      entropy->dc_context[ci] = 0;
    }
    /* AC needs no table when not present */
    if (cinfo->progressive_mode == 0 || cinfo->Se) {
      tbl = compptr->ac_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
        ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->ac_stats[tbl] == NULL)
        entropy->ac_stats[tbl] = (unsigned char *)(*cinfo->mem->alloc_small)
          ((j_common_ptr)cinfo, JPOOL_IMAGE, AC_STAT_BINS);
      MEMZERO(entropy->ac_stats[tbl], AC_STAT_BINS);
#ifdef CALCULATE_SPECTRAL_CONDITIONING
      if (cinfo->progressive_mode)
        /* Section G.1.3.2: Set appropriate arithmetic conditioning value Kx */
        cinfo->arith_ac_K[tbl] = cinfo->Ss +
                                 ((8 + cinfo->Se - cinfo->Ss) >> 4);
#endif
    }
  }

  /* Initialize arithmetic encoding variables */
  entropy->c = 0;
  entropy->a = 0x10000L;
  entropy->sc = 0;
  entropy->zc = 0;
  entropy->ct = 11;
  entropy->buffer = -1;  /* empty */

  /* Initialize restart stuff */
  entropy->restarts_to_go = cinfo->restart_interval;
  entropy->next_restart_num = 0;
}